

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

string * __thiscall
LTAircraft::GetFlightPhaseRwyString_abi_cxx11_(string *__return_storage_ptr__,LTAircraft *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  if ((this->phase < FPH_APPROACH) || ((this->fd->rwyId)._M_string_length == 0)) {
    GetFlightPhaseString_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    GetFlightPhaseString_abi_cxx11_(&local_38,this);
    std::operator+(&bStack_58,&local_38,' ');
    std::operator+(__return_storage_ptr__,&bStack_58,&this->fd->rwyId);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LTAircraft::GetFlightPhaseRwyString() const
{
    if (phase < FPH_APPROACH || fd.GetRwyId().empty())
        return GetFlightPhaseString();
    else
        return GetFlightPhaseString() + ' ' + fd.GetRwyId();
}